

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O3

service * asio::detail::service_registry::
          create<asio::detail::resolver_service<asio::ip::udp>,asio::io_context>(void *owner)

{
  service *psVar1;
  
  psVar1 = (service *)operator_new(0x68);
  (psVar1->key_).type_info_ = (type_info *)0x0;
  (psVar1->key_).id_ = (id *)0x0;
  psVar1->owner_ = (execution_context *)owner;
  psVar1->next_ = (service *)0x0;
  psVar1->_vptr_service = (_func_int **)&PTR__noncopyable_004d4728;
  resolver_service_base::resolver_service_base
            ((resolver_service_base *)(psVar1 + 1),(execution_context *)owner);
  psVar1->_vptr_service = (_func_int **)&PTR__resolver_service_004d4698;
  return psVar1;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}